

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

void Gia_ManSuperCollectXor_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Vec_Int_t *p_00;
  
  while( true ) {
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Gia_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStr.c"
                    ,0x23e,"void Gia_ManSuperCollectXor_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar1 = Gia_ObjIsXor(pObj);
    if (iVar1 == 0) break;
    iVar1 = Gia_ObjRefNum(p,pObj);
    p_00 = p->vSuper;
    if ((1 < iVar1) || (100 < p_00->nSize)) goto LAB_0063f3e2;
    if ((*(ulong *)pObj & 0x2000000020000000) != 0) {
      __assert_fail("!Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStr.c"
                    ,0x248,"void Gia_ManSuperCollectXor_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    Gia_ManSuperCollectXor_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff));
    pObj = pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff);
  }
  p_00 = p->vSuper;
LAB_0063f3e2:
  iVar1 = Gia_ObjToLit(p,pObj);
  Vec_IntPush(p_00,iVar1);
  return;
}

Assistant:

void Gia_ManSuperCollectXor_rec( Gia_Man_t * p, Gia_Obj_t * pObj, int fStrict )
{
    assert( !Gia_IsComplement(pObj) );
    if ( !Gia_ObjIsXor(pObj) ||     
        (fStrict && Gia_ObjRefNum(p, pObj) > 1) || 
        Gia_ObjRefNum(p, pObj) > 2 || 
        (Gia_ObjRefNum(p, pObj) == 2 && (Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)) == 1 || Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) == 1)) || 
        Vec_IntSize(p->vSuper) > 50 )
    {
        Vec_IntPush( p->vSuper, Gia_ObjToLit(p, pObj) );
        return;
    }
    assert( !Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) );
    Gia_ManSuperCollectXor_rec( p, Gia_ObjFanin0(pObj), fStrict );
    Gia_ManSuperCollectXor_rec( p, Gia_ObjFanin1(pObj), fStrict );
}